

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall sjtu::index_out_of_bound::~index_out_of_bound(index_out_of_bound *this)

{
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__0011d900;
  std::__cxx11::string::~string((string *)&this->wro);
  exception::~exception(&this->super_exception);
  return;
}

Assistant:

index_out_of_bound() {
	    wro = "index_out_of_bound";
	}